

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult(secp256k1_ecmult_context *ctx,secp256k1_gej *r,secp256k1_gej *a,
                     secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_scalar *r2;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  secp256k1_gej *psVar4;
  secp256k1_gej *a_00;
  long lVar5;
  secp256k1_ge *psVar6;
  secp256k1_gej *psVar7;
  secp256k1_ge *psVar8;
  secp256k1_gej *psVar9;
  secp256k1_ge *psVar10;
  int *piVar11;
  size_t len;
  long lVar12;
  uint uVar13;
  secp256k1_scalar *r1;
  secp256k1_ge *psVar14;
  bool bVar15;
  byte bVar16;
  long local_1470;
  uint local_145c;
  long local_1448;
  secp256k1_ge local_1438;
  secp256k1_fe Z;
  uint64_t local_13b8;
  uint64_t uStack_13b0;
  undefined1 local_13a8 [16];
  uint64_t local_1398;
  uint64_t uStack_1390;
  undefined1 local_1388 [16];
  secp256k1_strauss_point_state ps [1];
  secp256k1_fe zr [8];
  secp256k1_ge pre_a [8];
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_gej prej [8];
  secp256k1_ge pre_a_lam [8];
  
  bVar16 = 0;
  bVar15 = true;
  lVar5 = 0;
  len = 0;
  uVar13 = 0;
  local_1448 = 0;
  psVar4 = (secp256k1_gej *)na;
  while (((bVar15 && (iVar1 = secp256k1_scalar_is_zero(na), iVar1 == 0)) && (a->infinity == 0))) {
    ps[0].input_pos = 0;
    r1 = (secp256k1_scalar *)((long)ps[0].na_1.d + lVar5);
    r2 = (secp256k1_scalar *)((long)ps[0].na_lam.d + lVar5);
    secp256k1_scalar_split_lambda(r1,r2,na);
    iVar1 = (int)psVar4;
    ps[0].bits_na_1 =
         secp256k1_ecmult_wnaf
                   ((int *)((long)ps[0].wnaf_na_1 + lVar5),(int)r1,(secp256k1_scalar *)0x5,iVar1);
    ps[0].bits_na_lam =
         secp256k1_ecmult_wnaf
                   ((int *)((long)ps[0].wnaf_na_lam + lVar5),(int)r2,(secp256k1_scalar *)0x5,iVar1);
    uVar2 = ps[0].bits_na_1;
    if (ps[0].bits_na_1 <= (int)uVar13) {
      uVar2 = uVar13;
    }
    uVar13 = uVar2;
    if ((int)uVar2 < ps[0].bits_na_lam) {
      uVar13 = ps[0].bits_na_lam;
    }
    psVar4 = (secp256k1_gej *)(ulong)uVar13;
    local_1448 = local_1448 + 1;
    len = len + 8;
    lVar5 = lVar5 + 0x458;
    bVar15 = false;
  }
  if (local_1448 == 0) {
    Z.n[0] = 1;
    Z.n[1] = 0;
    Z.n[2] = 0;
    Z.n[3] = 0;
    Z.n[4] = 0;
  }
  else {
    secp256k1_ecmult_odd_multiples_table((int)prej,(secp256k1_gej *)zr,&a[ps[0].input_pos].x,psVar4)
    ;
    psVar4 = (secp256k1_gej *)pre_a;
    psVar6 = pre_a_lam;
    lVar5 = local_1448;
    while (lVar5 = lVar5 + -1, lVar5 != 0) {
      psVar7 = a + ps[0].input_pos;
      psVar9 = (secp256k1_gej *)pre_a;
      for (a_00 = (secp256k1_gej *)0x10; a_00 != (secp256k1_gej *)0x0;
          a_00 = (secp256k1_gej *)&a_00[-1].field_0x7f) {
        (psVar9->x).n[0] = (psVar7->x).n[0];
        psVar7 = (secp256k1_gej *)((long)psVar7 + (ulong)bVar16 * -0x10 + 8);
        psVar9 = (secp256k1_gej *)((long)psVar9 + (ulong)bVar16 * -0x10 + 8);
      }
      secp256k1_gej_rescale((secp256k1_gej *)pre_a,&psVar6[-1].y);
      secp256k1_ecmult_odd_multiples_table((int)psVar6,psVar4,(secp256k1_fe *)pre_a,a_00);
      secp256k1_fe_mul(&psVar4->x,&psVar4->x,&a[ps[0].input_pos].z);
      psVar4 = (secp256k1_gej *)(psVar4[2].y.n + 3);
      psVar6 = (secp256k1_ge *)(psVar6[0xb].y.n + 2);
    }
    psVar4 = prej;
    secp256k1_ge_globalz_set_table_gej(len,pre_a,&Z,psVar4,zr);
  }
  psVar6 = pre_a_lam;
  psVar14 = pre_a;
  for (lVar5 = 0; iVar1 = (int)psVar4, local_1448 != lVar5; lVar5 = lVar5 + 1) {
    for (lVar12 = 0; lVar12 != 0x2c0; lVar12 = lVar12 + 0x58) {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)((long)(psVar6->x).n + lVar12),
                 (secp256k1_ge *)((long)(psVar14->x).n + lVar12));
    }
    psVar6 = psVar6 + 8;
    psVar14 = psVar14 + 8;
  }
  if (ng == (secp256k1_scalar *)0x0) {
    uVar2 = 0;
    local_145c = 0;
  }
  else {
    local_1398 = ng->d[0];
    uStack_1390 = ng->d[1];
    local_1388 = (undefined1  [16])0x0;
    local_13b8 = ng->d[2];
    uStack_13b0 = ng->d[3];
    local_13a8 = (undefined1  [16])0x0;
    uVar2 = secp256k1_ecmult_wnaf(wnaf_ng_1,(int)&local_1398,(secp256k1_scalar *)0xf,iVar1);
    local_145c = secp256k1_ecmult_wnaf(wnaf_ng_128,(int)&local_13b8,(secp256k1_scalar *)0xf,iVar1);
    if ((int)uVar13 < (int)uVar2) {
      uVar13 = uVar2;
    }
    if ((int)uVar13 < (int)local_145c) {
      uVar13 = local_145c;
    }
  }
  secp256k1_gej_set_infinity(r);
  uVar3 = (ulong)uVar13;
  local_1470 = uVar3 * 4 + 0x3c;
  while (iVar1 = (int)uVar3, 0 < iVar1) {
    uVar3 = uVar3 - 1;
    secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
    piVar11 = &ps[0].bits_na_lam;
    psVar6 = pre_a;
    psVar14 = pre_a_lam;
    lVar5 = local_1448;
    while (bVar15 = lVar5 != 0, lVar5 = lVar5 + -1, bVar15) {
      if ((iVar1 <= piVar11[-1]) &&
         (uVar13 = *(uint *)((long)piVar11 + local_1470 + -0x44c), uVar13 != 0)) {
        if ((int)uVar13 < 1) {
          psVar8 = psVar6 + (~uVar13 >> 1);
          psVar10 = &local_1438;
          for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
            (psVar10->x).n[0] = (psVar8->x).n[0];
            psVar8 = (secp256k1_ge *)((long)psVar8 + (ulong)bVar16 * -0x10 + 8);
            psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar16 * -0x10 + 8);
          }
          local_1438.y.n[0] = 0x3ffffbfffff0bc - local_1438.y.n[0];
          local_1438.y.n[1] = 0x3ffffffffffffc - local_1438.y.n[1];
          local_1438.y.n[2] = 0x3ffffffffffffc - local_1438.y.n[2];
          local_1438.y.n[3] = 0x3ffffffffffffc - local_1438.y.n[3];
          local_1438.y.n[4] = 0x3fffffffffffc - local_1438.y.n[4];
        }
        else {
          psVar8 = psVar6 + (uVar13 - 1 >> 1);
          psVar10 = &local_1438;
          for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
            (psVar10->x).n[0] = (psVar8->x).n[0];
            psVar8 = (secp256k1_ge *)((long)psVar8 + (ulong)bVar16 * -0x10 + 8);
            psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar16 * -0x10 + 8);
          }
        }
        secp256k1_gej_add_ge_var(r,r,&local_1438,(secp256k1_fe *)0x0);
      }
      if ((iVar1 <= *piVar11) &&
         (uVar13 = *(uint *)((long)piVar11 + local_1470 + -0x248), uVar13 != 0)) {
        if ((int)uVar13 < 1) {
          psVar8 = psVar14 + (~uVar13 >> 1);
          psVar10 = &local_1438;
          for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
            (psVar10->x).n[0] = (psVar8->x).n[0];
            psVar8 = (secp256k1_ge *)((long)psVar8 + (ulong)bVar16 * -0x10 + 8);
            psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar16 * -0x10 + 8);
          }
          local_1438.y.n[0] = 0x3ffffbfffff0bc - local_1438.y.n[0];
          local_1438.y.n[1] = 0x3ffffffffffffc - local_1438.y.n[1];
          local_1438.y.n[2] = 0x3ffffffffffffc - local_1438.y.n[2];
          local_1438.y.n[3] = 0x3ffffffffffffc - local_1438.y.n[3];
          local_1438.y.n[4] = 0x3fffffffffffc - local_1438.y.n[4];
        }
        else {
          psVar8 = psVar14 + (uVar13 - 1 >> 1);
          psVar10 = &local_1438;
          for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
            (psVar10->x).n[0] = (psVar8->x).n[0];
            psVar8 = (secp256k1_ge *)((long)psVar8 + (ulong)bVar16 * -0x10 + 8);
            psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar16 * -0x10 + 8);
          }
        }
        secp256k1_gej_add_ge_var(r,r,&local_1438,(secp256k1_fe *)0x0);
      }
      psVar14 = psVar14 + 8;
      psVar6 = psVar6 + 8;
      piVar11 = piVar11 + 0x116;
    }
    if ((iVar1 <= (int)uVar2) && (uVar13 = wnaf_ng_1[uVar3], uVar13 != 0)) {
      if ((int)uVar13 < 1) {
        secp256k1_ge_from_storage
                  (&local_1438,(secp256k1_ge_storage *)(ctx->pre_g + (ulong)(~uVar13 >> 1) * 0x40));
        local_1438.y.n[0] = 0x3ffffbfffff0bc - local_1438.y.n[0];
        local_1438.y.n[1] = 0x3ffffffffffffc - local_1438.y.n[1];
        local_1438.y.n[2] = 0x3ffffffffffffc - local_1438.y.n[2];
        local_1438.y.n[3] = 0x3ffffffffffffc - local_1438.y.n[3];
        local_1438.y.n[4] = 0x3fffffffffffc - local_1438.y.n[4];
      }
      else {
        secp256k1_ge_from_storage
                  (&local_1438,
                   (secp256k1_ge_storage *)(ctx->pre_g + (ulong)(uVar13 - 1 >> 1) * 0x40));
      }
      secp256k1_gej_add_zinv_var(r,r,&local_1438,&Z);
    }
    if ((iVar1 <= (int)local_145c) && (uVar13 = wnaf_ng_128[uVar3], uVar13 != 0)) {
      if ((int)uVar13 < 1) {
        secp256k1_ge_from_storage
                  (&local_1438,
                   (secp256k1_ge_storage *)(ctx->pre_g_128 + (ulong)(~uVar13 >> 1) * 0x40));
        local_1438.y.n[0] = 0x3ffffbfffff0bc - local_1438.y.n[0];
        local_1438.y.n[1] = 0x3ffffffffffffc - local_1438.y.n[1];
        local_1438.y.n[2] = 0x3ffffffffffffc - local_1438.y.n[2];
        local_1438.y.n[3] = 0x3ffffffffffffc - local_1438.y.n[3];
        local_1438.y.n[4] = 0x3fffffffffffc - local_1438.y.n[4];
      }
      else {
        secp256k1_ge_from_storage
                  (&local_1438,
                   (secp256k1_ge_storage *)(ctx->pre_g_128 + (ulong)(uVar13 - 1 >> 1) * 0x40));
      }
      secp256k1_gej_add_zinv_var(r,r,&local_1438,&Z);
    }
    local_1470 = local_1470 + -4;
  }
  if (r->infinity == 0) {
    secp256k1_fe_mul(&r->z,&r->z,&Z);
  }
  return;
}

Assistant:

static void secp256k1_ecmult(const secp256k1_ecmult_context *ctx, secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_gej prej[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_fe zr[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_state state;

    state.prej = prej;
    state.zr = zr;
    state.pre_a = pre_a;
    state.pre_a_lam = pre_a_lam;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(ctx, &state, r, 1, a, na, ng);
}